

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynForEachIterator * ParseForEachIterator(ParseContext *ctx,bool isFirst)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  int iVar3;
  SynBase *pSVar4;
  Lexeme *pLVar5;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_00;
  SynForEachIterator *this_01;
  SynIdentifier *this;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  pSVar4 = ParseType(ctx,(bool *)0x0,false);
  pLVar5 = ctx->currentLexeme;
  if (ctx->currentLexeme->type != lex_string) {
    ctx->currentLexeme = begin;
    pSVar4 = (SynBase *)0x0;
    pLVar5 = begin;
    if (begin->type != lex_string) {
      return (SynForEachIterator *)0x0;
    }
  }
  pcVar2 = pLVar5->pos;
  uVar1 = pLVar5->length;
  ctx->currentLexeme = pLVar5 + 1;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
  if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00119486:
    __assert_fail("currentLexeme > firstLexeme",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x19c,"Lexeme *ParseContext::Previous()");
  }
  pLVar5 = ctx->currentLexeme + -1;
  SynBase::SynBase((SynBase *)this,4,pLVar5,pLVar5);
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
  (this->name).begin = pcVar2;
  (this->name).end = pcVar2 + uVar1;
  if ((isFirst) && (ctx->currentLexeme->type != lex_in)) {
    ctx->currentLexeme = begin;
    this_01 = (SynForEachIterator *)0x0;
  }
  else {
    anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_in,"ERROR: \'in\' expected after variable name");
    this_00 = ParseTernaryExpr(ctx);
    if (this_00 == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'in\'");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
      this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
      SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
      this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynForEachIterator *)CONCAT44(extraout_var_01,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00119486;
    SynBase::SynBase((SynBase *)this_01,0x29,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fba8;
    this_01->type = pSVar4;
    this_01->name = this;
    this_01->value = this_00;
  }
  return this_01;
}

Assistant:

SynForEachIterator* ParseForEachIterator(ParseContext &ctx, bool isFirst)
{
	Lexeme *start = ctx.currentLexeme;

	// Optional type
	SynBase *type = ParseType(ctx);

	// Must be followed by a type
	if(!ctx.At(lex_string))
	{
		// Backtrack
		ctx.currentLexeme = start;

		type = NULL;
	}

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(isFirst && !ctx.At(lex_in))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_in, "ERROR: 'in' expected after variable name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'in'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEachIterator>()) SynForEachIterator(start, ctx.Previous(), type, nameIdentifier, value);
	}

	return NULL;
}